

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O0

upb_StringView strviewdup2(upb_ToProto_Context *ctx,upb_StringView str)

{
  upb_StringView uVar1;
  char *__dest;
  size_t size;
  char *p;
  upb_ToProto_Context *ctx_local;
  upb_StringView str_local;
  
  size = str.size;
  __dest = (char *)upb_Arena_Malloc(ctx->arena,size);
  if (__dest == (char *)0x0) {
    siglongjmp((__jmp_buf_tag *)ctx->err,1);
  }
  memcpy(__dest,str.data,size);
  uVar1.size = size;
  uVar1.data = __dest;
  return uVar1;
}

Assistant:

static upb_StringView strviewdup2(upb_ToProto_Context* ctx,
                                  upb_StringView str) {
  char* p = upb_Arena_Malloc(ctx->arena, str.size);
  CHK_OOM(p);
  memcpy(p, str.data, str.size);
  return (upb_StringView){.data = p, .size = str.size};
}